

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O1

void draw_scene(GLFWwindow *window)

{
  glClear(0x4100);
  glMatrixMode(0x1700);
  glLoadIdentity();
  glTranslatef(0,0,-zoom);
  glRotatef(beta,0x3f800000,0,0);
  glRotatef(alpha,0,0,0x3f800000);
  glDrawElements(7,0x2584,0x1405,quad);
  glfwSwapBuffers(window);
  return;
}

Assistant:

void draw_scene(GLFWwindow* window)
{
    // Clear the color and depth buffers
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

    // We don't want to modify the projection matrix
    glMatrixMode(GL_MODELVIEW);
    glLoadIdentity();

    // Move back
    glTranslatef(0.0, 0.0, -zoom);
    // Rotate the view
    glRotatef(beta, 1.0, 0.0, 0.0);
    glRotatef(alpha, 0.0, 0.0, 1.0);

    glDrawElements(GL_QUADS, 4 * QUADNUM, GL_UNSIGNED_INT, quad);

    glfwSwapBuffers(window);
}